

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

void __thiscall vectorgraphics::TikzPlotter::cleanup(TikzPlotter *this,EVP_PKEY_CTX *ctx)

{
  path pStack_98;
  path local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
                 ".aux");
  std::filesystem::__cxx11::path::path(&pStack_98,&local_48,auto_format);
  std::filesystem::__cxx11::operator/(&local_70,(path *)this,&pStack_98);
  std::filesystem::remove(&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&pStack_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
                 ".log");
  std::filesystem::__cxx11::path::path(&pStack_98,&local_48,auto_format);
  std::filesystem::__cxx11::operator/(&local_70,(path *)this,&pStack_98);
  std::filesystem::remove(&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&pStack_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
                 ".sta");
  std::filesystem::__cxx11::path::path(&pStack_98,&local_48,auto_format);
  std::filesystem::__cxx11::operator/(&local_70,(path *)this,&pStack_98);
  std::filesystem::remove(&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&pStack_98);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

bool TikzPlotter::cleanup(std::filesystem::path path, std::string name) {
    bool success = true;
    success &= std::filesystem::remove(path / (name + ".aux"));
    success &= std::filesystem::remove(path / (name + ".log"));
    success &= std::filesystem::remove(path / (name + ".sta"));
    return success;
  }